

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SSBOConcurrentAtomicCase::deinit
          (SSBOConcurrentAtomicCase *this)

{
  code *pcVar1;
  ShaderProgram *this_00;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar4;
  undefined4 extraout_var_00;
  reference pvVar5;
  int local_14;
  int ndx;
  SSBOConcurrentAtomicCase *this_local;
  
  if (this->m_bufferID != 0) {
    pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,&this->m_bufferID);
    this->m_bufferID = 0;
  }
  local_14 = 0;
  while( true ) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_intermediateResultBuffers);
    if ((int)sVar4 <= local_14) break;
    pRVar3 = Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    pcVar1 = *(code **)(CONCAT44(extraout_var_00,iVar2) + 0x438);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_intermediateResultBuffers,(long)local_14);
    (*pcVar1)(1,pvVar5);
    local_14 = local_14 + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            (&this->m_intermediateResultBuffers);
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

void SSBOConcurrentAtomicCase::deinit (void)
{
	if (m_bufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_bufferID);
		m_bufferID = 0;
	}

	for (int ndx = 0; ndx < (int)m_intermediateResultBuffers.size(); ++ndx)
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_intermediateResultBuffers[ndx]);
	m_intermediateResultBuffers.clear();

	delete m_program;
	m_program = DE_NULL;
}